

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeCreateTable(Btree *p,Pgno *piTable,int createTabFlags)

{
  Pgno PVar1;
  int iVar2;
  bool bVar3;
  Pgno local_58;
  u8 local_51;
  Pgno iPtrPage;
  u8 eType;
  MemPage *pPageMove;
  Pgno pgnoMove;
  int ptfFlags;
  int rc;
  Pgno pgnoRoot;
  MemPage *pRoot;
  BtShared *pBt;
  Pgno *pPStack_20;
  int createTabFlags_local;
  Pgno *piTable_local;
  Btree *p_local;
  
  pRoot = (MemPage *)p->pBt;
  pBt._4_4_ = createTabFlags;
  pPStack_20 = piTable;
  piTable_local = (Pgno *)p;
  if (((BtShared *)pRoot)->autoVacuum == '\0') {
    iVar2 = allocateBtreePage((BtShared *)pRoot,(MemPage **)&rc,(Pgno *)&ptfFlags,1,'\0');
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  else {
    invalidateAllOverflowCache((BtShared *)pRoot);
    sqlite3BtreeGetMeta((Btree *)piTable_local,4,(u32 *)&ptfFlags);
    iVar2 = ptfFlags;
    PVar1 = btreePagecount((BtShared *)pRoot);
    if (PVar1 < (uint)iVar2) {
      iVar2 = sqlite3CorruptError(0x13a84);
      return iVar2;
    }
    do {
      ptfFlags = ptfFlags + 1;
      iVar2 = ptfFlags;
      PVar1 = ptrmapPageno((BtShared *)pRoot,ptfFlags);
      bVar3 = true;
      if (iVar2 != PVar1) {
        bVar3 = ptfFlags == (uint)sqlite3PendingByte / *(uint *)((long)pRoot->apOvfl + 0xc) + 1;
      }
    } while (bVar3);
    pgnoMove = allocateBtreePage((BtShared *)pRoot,(MemPage **)&iPtrPage,(Pgno *)&pPageMove,ptfFlags
                                 ,'\x01');
    if (pgnoMove != 0) {
      return pgnoMove;
    }
    if ((Pgno)pPageMove == ptfFlags) {
      _rc = _iPtrPage;
      pgnoMove = 0;
    }
    else {
      local_51 = '\0';
      local_58 = 0;
      pgnoMove = saveAllCursors((BtShared *)pRoot,0,(BtCursor *)0x0);
      releasePage(_iPtrPage);
      if (pgnoMove != 0) {
        return pgnoMove;
      }
      pgnoMove = btreeGetPage((BtShared *)pRoot,ptfFlags,(MemPage **)&rc,0);
      if (pgnoMove != 0) {
        return pgnoMove;
      }
      pgnoMove = ptrmapGet((BtShared *)pRoot,ptfFlags,&local_51,&local_58);
      if ((local_51 == '\x01') || (local_51 == '\x02')) {
        pgnoMove = sqlite3CorruptError(0x13ab4);
      }
      if (pgnoMove != 0) {
        releasePage(_rc);
        return pgnoMove;
      }
      pgnoMove = relocatePage((BtShared *)pRoot,_rc,local_51,local_58,(Pgno)pPageMove,0);
      releasePage(_rc);
      if (pgnoMove != 0) {
        return pgnoMove;
      }
      pgnoMove = btreeGetPage((BtShared *)pRoot,ptfFlags,(MemPage **)&rc,0);
      if (pgnoMove != 0) {
        return pgnoMove;
      }
      pgnoMove = sqlite3PagerWrite(_rc->pDbPage);
      if (pgnoMove != 0) {
        releasePage(_rc);
        return pgnoMove;
      }
    }
    ptrmapPut((BtShared *)pRoot,ptfFlags,'\x01',0,(int *)&pgnoMove);
    if (pgnoMove != 0) {
      releasePage(_rc);
      return pgnoMove;
    }
    pgnoMove = sqlite3BtreeUpdateMeta((Btree *)piTable_local,4,ptfFlags);
    if (pgnoMove != 0) {
      releasePage(_rc);
      return pgnoMove;
    }
  }
  pgnoMove = 0;
  if ((pBt._4_4_ & 1) == 0) {
    pPageMove._4_4_ = 10;
  }
  else {
    pPageMove._4_4_ = 0xd;
  }
  zeroPage(_rc,pPageMove._4_4_);
  sqlite3PagerUnref(_rc->pDbPage);
  *pPStack_20 = ptfFlags;
  return 0;
}

Assistant:

static int btreeCreateTable(Btree *p, Pgno *piTable, int createTabFlags){
  BtShared *pBt = p->pBt;
  MemPage *pRoot;
  Pgno pgnoRoot;
  int rc;
  int ptfFlags;          /* Page-type flags for the root page of new table */

  assert( sqlite3BtreeHoldsMutex(p) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );

#ifdef SQLITE_OMIT_AUTOVACUUM
  rc = allocateBtreePage(pBt, &pRoot, &pgnoRoot, 1, 0);
  if( rc ){
    return rc;
  }
#else
  if( pBt->autoVacuum ){
    Pgno pgnoMove;      /* Move a page here to make room for the root-page */
    MemPage *pPageMove; /* The page to move to. */

    /* Creating a new table may probably require moving an existing database
    ** to make room for the new tables root page. In case this page turns
    ** out to be an overflow page, delete all overflow page-map caches
    ** held by open cursors.
    */
    invalidateAllOverflowCache(pBt);

    /* Read the value of meta[3] from the database to determine where the
    ** root page of the new table should go. meta[3] is the largest root-page
    ** created so far, so the new root-page is (meta[3]+1).
    */
    sqlite3BtreeGetMeta(p, BTREE_LARGEST_ROOT_PAGE, &pgnoRoot);
    if( pgnoRoot>btreePagecount(pBt) ){
      return SQLITE_CORRUPT_PGNO(pgnoRoot);
    }
    pgnoRoot++;

    /* The new root-page may not be allocated on a pointer-map page, or the
    ** PENDING_BYTE page.
    */
    while( pgnoRoot==PTRMAP_PAGENO(pBt, pgnoRoot) ||
        pgnoRoot==PENDING_BYTE_PAGE(pBt) ){
      pgnoRoot++;
    }
    assert( pgnoRoot>=3 );

    /* Allocate a page. The page that currently resides at pgnoRoot will
    ** be moved to the allocated page (unless the allocated page happens
    ** to reside at pgnoRoot).
    */
    rc = allocateBtreePage(pBt, &pPageMove, &pgnoMove, pgnoRoot, BTALLOC_EXACT);
    if( rc!=SQLITE_OK ){
      return rc;
    }

    if( pgnoMove!=pgnoRoot ){
      /* pgnoRoot is the page that will be used for the root-page of
      ** the new table (assuming an error did not occur). But we were
      ** allocated pgnoMove. If required (i.e. if it was not allocated
      ** by extending the file), the current page at position pgnoMove
      ** is already journaled.
      */
      u8 eType = 0;
      Pgno iPtrPage = 0;

      /* Save the positions of any open cursors. This is required in
      ** case they are holding a reference to an xFetch reference
      ** corresponding to page pgnoRoot.  */
      rc = saveAllCursors(pBt, 0, 0);
      releasePage(pPageMove);
      if( rc!=SQLITE_OK ){
        return rc;
      }

      /* Move the page currently at pgnoRoot to pgnoMove. */
      rc = btreeGetPage(pBt, pgnoRoot, &pRoot, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      rc = ptrmapGet(pBt, pgnoRoot, &eType, &iPtrPage);
      if( eType==PTRMAP_ROOTPAGE || eType==PTRMAP_FREEPAGE ){
        rc = SQLITE_CORRUPT_PGNO(pgnoRoot);
      }
      if( rc!=SQLITE_OK ){
        releasePage(pRoot);
        return rc;
      }
      assert( eType!=PTRMAP_ROOTPAGE );
      assert( eType!=PTRMAP_FREEPAGE );
      rc = relocatePage(pBt, pRoot, eType, iPtrPage, pgnoMove, 0);
      releasePage(pRoot);

      /* Obtain the page at pgnoRoot */
      if( rc!=SQLITE_OK ){
        return rc;
      }
      rc = btreeGetPage(pBt, pgnoRoot, &pRoot, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      rc = sqlite3PagerWrite(pRoot->pDbPage);
      if( rc!=SQLITE_OK ){
        releasePage(pRoot);
        return rc;
      }
    }else{
      pRoot = pPageMove;
    }

    /* Update the pointer-map and meta-data with the new root-page number. */
    ptrmapPut(pBt, pgnoRoot, PTRMAP_ROOTPAGE, 0, &rc);
    if( rc ){
      releasePage(pRoot);
      return rc;
    }

    /* When the new root page was allocated, page 1 was made writable in
    ** order either to increase the database filesize, or to decrement the
    ** freelist count.  Hence, the sqlite3BtreeUpdateMeta() call cannot fail.
    */
    assert( sqlite3PagerIswriteable(pBt->pPage1->pDbPage) );
    rc = sqlite3BtreeUpdateMeta(p, 4, pgnoRoot);
    if( NEVER(rc) ){
      releasePage(pRoot);
      return rc;
    }

  }else{
    rc = allocateBtreePage(pBt, &pRoot, &pgnoRoot, 1, 0);
    if( rc ) return rc;
  }
#endif
  assert( sqlite3PagerIswriteable(pRoot->pDbPage) );
  if( createTabFlags & BTREE_INTKEY ){
    ptfFlags = PTF_INTKEY | PTF_LEAFDATA | PTF_LEAF;
  }else{
    ptfFlags = PTF_ZERODATA | PTF_LEAF;
  }
  zeroPage(pRoot, ptfFlags);
  sqlite3PagerUnref(pRoot->pDbPage);
  assert( (pBt->openFlags & BTREE_SINGLE)==0 || pgnoRoot==2 );
  *piTable = pgnoRoot;
  return SQLITE_OK;
}